

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPTCPTransmitter::Poll(RTPTCPTransmitter *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  size_t i;
  ulong uVar3;
  SocketType sock;
  vector<int,_std::allocator<int>_> errSockets;
  
  iVar1 = -0xb5;
  if ((this->m_init == true) && (iVar1 = -0xbb, this->m_created == true)) {
    p_Var2 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar1 = 0;
    for (; (_Rb_tree_header *)p_Var2 != &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      sock = p_Var2[1]._M_color;
      iVar1 = PollSocket(this,sock,(SocketData *)&p_Var2[1]._M_parent);
      if (iVar1 < 0) {
        if (iVar1 == -1) {
          iVar1 = -1;
          break;
        }
        iVar1 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(&errSockets,&sock);
      }
    }
    uVar3 = 0;
    while( true ) {
      if ((ulong)((long)errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar3) break;
      (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[0x22])
                (this,(ulong)(uint)errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar3]);
      uVar3 = uVar3 + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&errSockets.super__Vector_base<int,_std::allocator<int>_>);
  }
  return iVar1;
}

Assistant:

int RTPTCPTransmitter::Poll()
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();
	int status = 0;

	vector<SocketType> errSockets;

	while (it != end)
	{
		SocketType sock = it->first;
		status = PollSocket(sock, it->second);
		if (status < 0)
		{
			// Stop immediately on out of memory
			if (status == ERR_RTP_OUTOFMEM)
				break;
			else
			{
				errSockets.push_back(sock);
				// Don't let this count as an error (due to a closed connection for example),
				// otherwise the poll thread (if used) will stop because of this. Since there
				// may be more than one connection, that's not desirable in general.
				status = 0; 
			}
		}
		++it;
	}
	MAINMUTEX_UNLOCK

	for (size_t i = 0 ; i < errSockets.size() ; i++)
		OnReceiveError(errSockets[i]);

	return status;
}